

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O3

void __thiscall
ConfidentialTxIn_EstimateTxInVsize_Test::TestBody(ConfidentialTxIn_EstimateTxInVsize_Test *this)

{
  AddressType addr_type;
  uint32_t pegin_btc_tx_size;
  string *psVar1;
  bool bVar2;
  int iVar3;
  string *hex;
  long lVar4;
  char *message;
  Script *scriptsig_template;
  initializer_list<TestEstimateConfidentialTxInSizeVector> __l;
  AssertHelper AStack_ab8;
  uint32_t vsize;
  AssertionResult gtest_ar;
  undefined1 local_a98 [16];
  undefined1 local_a88 [32];
  pointer local_a68;
  Script local_a60;
  Script local_a28;
  Script script_template;
  Script local_9a0;
  undefined2 local_968;
  bool local_966;
  _Alloc_hider local_960;
  char local_950 [16];
  undefined8 local_940;
  uint32_t local_938;
  undefined8 local_930;
  undefined4 local_928;
  Script local_920;
  undefined4 local_8e8;
  Script local_8e0;
  undefined2 local_8a8;
  undefined1 local_8a6;
  undefined1 *local_8a0 [2];
  undefined1 local_890 [16];
  undefined8 local_880;
  undefined4 local_878;
  undefined8 local_870;
  undefined4 local_868;
  Script local_860;
  undefined4 local_828;
  Script local_820;
  undefined2 local_7e8;
  undefined1 local_7e6;
  undefined1 *local_7e0 [2];
  undefined1 local_7d0 [16];
  undefined8 local_7c0;
  undefined4 local_7b8;
  undefined8 local_7b0;
  undefined4 local_7a8;
  Script local_7a0;
  undefined4 local_768;
  Script local_760;
  undefined2 local_728;
  undefined1 local_726;
  undefined1 *local_720 [2];
  undefined1 local_710 [16];
  undefined8 local_700;
  undefined4 local_6f8;
  undefined8 local_6f0;
  undefined4 local_6e8;
  Script local_6e0;
  undefined4 local_6a8;
  Script local_6a0;
  undefined2 local_668;
  undefined1 local_666;
  undefined1 *local_660 [2];
  undefined1 local_650 [16];
  undefined8 local_640;
  undefined4 local_638;
  undefined8 local_630;
  undefined4 local_628;
  Script local_620;
  undefined4 local_5e8;
  Script local_5e0;
  undefined2 local_5a8;
  undefined1 local_5a6;
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined8 local_580;
  undefined4 local_578;
  undefined8 local_570;
  undefined4 local_568;
  Script local_560;
  undefined4 local_528;
  Script local_520;
  undefined2 local_4e8;
  undefined1 local_4e6;
  undefined1 *local_4e0 [2];
  undefined1 local_4d0 [16];
  undefined8 local_4c0;
  undefined4 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  Script local_4a0;
  undefined4 local_468;
  Script local_460;
  undefined2 local_428;
  undefined1 local_426;
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined8 local_400;
  undefined4 local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e8;
  Script local_3e0;
  undefined4 local_3a8;
  Script local_3a0;
  undefined2 local_368;
  undefined1 local_366;
  undefined1 *local_360 [2];
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined4 local_338;
  undefined8 local_330;
  undefined4 local_328;
  Script local_320;
  undefined4 local_2e8;
  Script local_2e0;
  undefined2 local_2a8;
  undefined1 local_2a6;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  undefined8 local_280;
  undefined4 local_278;
  undefined8 local_270;
  undefined4 local_268;
  Script local_260;
  undefined4 local_228;
  Script local_220;
  undefined2 local_1e8;
  undefined1 local_1e6;
  undefined1 *local_1e0 [2];
  undefined1 local_1d0 [16];
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  Script local_1a0;
  undefined4 local_168;
  Script local_160;
  undefined2 local_128;
  undefined1 local_126;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  Script local_e0;
  undefined4 local_a8;
  Script local_a0;
  undefined2 local_68;
  undefined1 local_66;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined8 local_40;
  undefined4 local_38;
  
  if (TestBody()::multisig_script_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::multisig_script_abi_cxx11_);
    if (iVar3 != 0) {
      TestBody()::multisig_script_abi_cxx11_._M_dataplus._M_p =
           (pointer)&TestBody()::multisig_script_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&TestBody()::multisig_script_abi_cxx11_,
                 "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::multisig_script_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&TestBody()::multisig_script_abi_cxx11_);
    }
  }
  if (TestBody()::test_vector == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::test_vector);
    if (iVar3 != 0) {
      script_template._vptr_Script = (_func_int **)0x9600000002;
      script_template.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      cfd::core::Script::Script
                ((Script *)
                 &script_template.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      cfd::core::Script::Script(&local_9a0);
      local_968._0_1_ = false;
      local_968._1_1_ = false;
      local_966 = false;
      local_960._M_p = local_950;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"");
      local_940._0_4_ = 0;
      local_940._4_4_ = 0;
      local_938 = 0;
      local_930 = 0xcd00000001;
      local_928 = 0;
      cfd::core::Script::Script(&local_920,&exp_script);
      local_8e8 = 0;
      cfd::core::Script::Script(&local_8e0);
      local_8a8 = 0;
      local_8a6 = 0;
      local_8a0[0] = local_890;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_8a0,"");
      local_880 = 0;
      local_878 = 0;
      local_870 = 0x5c00000006;
      local_868 = 0;
      cfd::core::Script::Script(&local_860);
      local_828 = 0;
      cfd::core::Script::Script(&local_820);
      local_7e8 = 0;
      local_7e6 = 0;
      local_7e0[0] = local_7d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_7e0,"");
      local_7c0 = 0;
      local_7b8 = 0;
      local_7b0 = 0x7100000005;
      local_7a8 = 0;
      gtest_ar._0_8_ = local_a98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar,"51","");
      cfd::core::Script::Script(&local_7a0,(string *)&gtest_ar);
      local_768 = 0;
      cfd::core::Script::Script(&local_760);
      local_728 = 0;
      local_726 = 0;
      local_720[0] = local_710;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"");
      local_700 = 0;
      local_6f8 = 0;
      local_6f0 = 0x4500000004;
      local_6e8 = 0;
      cfd::core::Script::Script(&local_6e0);
      local_6a8 = 0;
      cfd::core::Script::Script(&local_6a0);
      local_668 = 0;
      local_666 = 0;
      local_660[0] = local_650;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"");
      local_640 = 0;
      local_638 = 0;
      local_630 = 0x5300000003;
      local_628 = 0;
      cfd::core::Script::Script(&local_620,&exp_script);
      local_5e8 = 0;
      cfd::core::Script::Script(&local_5e0);
      local_5a8 = 0;
      local_5a6 = 0;
      local_5a0[0] = local_590;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"");
      local_580 = 0;
      local_578 = 0;
      local_570 = 0x6a00000003;
      local_568 = 0;
      cfd::core::Script::Script(&local_560,&TestBody()::multisig_script_abi_cxx11_);
      local_528 = 0;
      cfd::core::Script::Script(&local_520);
      local_4e8 = 0;
      local_4e6 = 0;
      local_4e0[0] = local_4d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"");
      local_4c0 = 0;
      local_4b8 = 0;
      local_4b0 = 0xfc00000004;
      local_4a8 = 0;
      cfd::core::Script::Script(&local_4a0);
      local_468 = 0xe2;
      local_a88._0_8_ = (AssertHelperData *)(local_a88 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a88,"0014e8d28b573816ddfcf98578d7b28543e273f5a72a","");
      cfd::core::Script::Script(&local_460,(string *)local_a88);
      local_428 = 0;
      local_426 = 0;
      local_420[0] = local_410;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"");
      local_400 = 0;
      local_3f8 = 400;
      local_3f0 = 0x9700000004;
      local_3e8 = 0;
      cfd::core::Script::Script(&local_3e0);
      local_3a8 = 0;
      cfd::core::Script::Script(&local_3a0);
      local_368 = 1;
      local_366 = 0;
      local_360[0] = local_350;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"");
      local_340 = 0;
      local_338 = 0;
      local_330 = 0x8cd00000004;
      local_328 = 0;
      cfd::core::Script::Script(&local_320);
      local_2e8 = 0;
      cfd::core::Script::Script(&local_2e0);
      local_2a8 = 0x101;
      local_2a6 = 0;
      local_2a0[0] = local_290;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"");
      local_280 = 0x2400000000;
      local_278 = 0;
      local_270 = 0x8ed00000004;
      local_268 = 0;
      cfd::core::Script::Script(&local_260);
      local_228 = 0;
      cfd::core::Script::Script(&local_220);
      local_1e8 = 0x101;
      local_1e6 = 0;
      local_1e0[0] = local_1d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
      local_1c0 = 0x3400000000;
      local_1b8 = 0;
      local_1b0 = 0x4ca00000004;
      local_1a8 = 0;
      cfd::core::Script::Script(&local_1a0);
      local_168 = 0;
      cfd::core::Script::Script(&local_160);
      local_128 = 0x101;
      local_126 = 1;
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
      local_100 = 0x2400000000;
      local_f8 = 0;
      local_f0 = 0x4da00000004;
      local_e8 = 0;
      cfd::core::Script::Script(&local_e0);
      local_a8 = 0;
      cfd::core::Script::Script(&local_a0);
      local_68 = 0x101;
      local_66 = 1;
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
      local_40 = 0x3400000000;
      local_38 = 0;
      __l._M_len = 0xd;
      __l._M_array = (iterator)&script_template;
      std::
      vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
      ::vector(&TestBody::test_vector,__l,(allocator_type *)&AStack_ab8);
      lVar4 = 0x900;
      do {
        TestEstimateConfidentialTxInSizeVector::~TestEstimateConfidentialTxInSizeVector
                  ((TestEstimateConfidentialTxInSizeVector *)
                   ((long)&script_template._vptr_Script + lVar4));
        lVar4 = lVar4 + -0xc0;
      } while (lVar4 != -0xc0);
      if ((AssertHelperData *)local_a88._0_8_ != (AssertHelperData *)(local_a88 + 0x10)) {
        operator_delete((void *)local_a88._0_8_);
      }
      if ((undefined1 *)gtest_ar._0_8_ != local_a98) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      __cxa_atexit(std::
                   vector<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
                   ::~vector,&TestBody::test_vector,&__dso_handle);
      __cxa_guard_release(&TestBody()::test_vector);
    }
  }
  local_a68 = TestBody::test_vector.
              super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (TestBody::test_vector.
      super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      TestBody::test_vector.
      super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    hex = &(TestBody::test_vector.
            super__Vector_base<TestEstimateConfidentialTxInSizeVector,_std::allocator<TestEstimateConfidentialTxInSizeVector>_>
            ._M_impl.super__Vector_impl_data._M_start)->script_template;
    do {
      vsize = 0;
      cfd::core::Script::Script(&script_template,hex);
      scriptsig_template = (Script *)hex->_M_string_length;
      if ((Script *)hex->_M_string_length != (Script *)0x0) {
        scriptsig_template = &script_template;
      }
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          addr_type = *(AddressType *)&hex[-5].field_2;
          cfd::core::Script::Script(&local_a60,(Script *)(hex + -4));
          pegin_btc_tx_size = *(uint32_t *)((long)&hex[-3].field_2 + 8);
          cfd::core::Script::Script(&local_a28,(Script *)(hex + -2));
          vsize = cfd::core::ConfidentialTxIn::EstimateTxInVsize
                            (addr_type,&local_a60,pegin_btc_tx_size,&local_a28,
                             (bool)hex[-1].field_2._M_local_buf[8],
                             (bool)hex[-1].field_2._M_local_buf[9],
                             (bool)hex[-1].field_2._M_local_buf[10],scriptsig_template,
                             *(int *)&hex[1]._M_dataplus._M_p,
                             *(int *)((long)&hex[1]._M_dataplus._M_p + 4),(uint32_t *)0x0,
                             (uint32_t)hex[1]._M_string_length);
          cfd::core::Script::~Script(&local_a28);
          cfd::core::Script::~Script(&local_a60);
        }
      }
      else {
        testing::Message::Message((Message *)&gtest_ar);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_a88,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x14a,
                   "Expected: (vsize = ConfidentialTxIn::EstimateTxInVsize( test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx, test_data.claim_script, test_data.is_issuance, test_data.is_blind, test_data.is_reissuance, template_ptr, test_data.exponent, test_data.minimum_bits, nullptr, test_data.txoutproof_size)) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)local_a88,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a88);
        if (gtest_ar._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
        }
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&gtest_ar,"vsize","test_data.size",&vsize,
                 (uint *)(hex[-5].field_2._M_local_buf + 4));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)local_a88);
        message = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_ab8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x14b,message);
        testing::internal::AssertHelper::operator=(&AStack_ab8,(Message *)local_a88);
        testing::internal::AssertHelper::~AssertHelper(&AStack_ab8);
        if ((AssertHelperData *)local_a88._0_8_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((AssertHelperData *)local_a88._0_8_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a88._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      cfd::core::Script::~Script(&script_template);
      psVar1 = hex + 1;
      hex = hex + 6;
    } while ((pointer)&psVar1->field_2 != local_a68);
  }
  return;
}

Assistant:

TEST(ConfidentialTxIn, EstimateTxInVsize) {
  static const std::string multisig_script = "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae";
  static const std::vector<TestEstimateConfidentialTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shAddress, 205, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wpkhAddress, 92, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2shP2wshAddress, 113, 0, Script("51"), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, 69, 0, Script(), 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 83, 0, exp_script, 0, Script(), false, false, false, "", 0, 0, 0},
    {AddressType::kP2wshAddress, 106, 0, Script(multisig_script), 0, Script(), false, false, false, "", 0, 0, 0},
    // pegin
    {AddressType::kP2wpkhAddress, 252, 0, Script(), 226,
     Script("0014e8d28b573816ddfcf98578d7b28543e273f5a72a"), false, false, false, "", 0, 0, 400},
    // issue
    {AddressType::kP2wpkhAddress, 151, 0, Script(), 0, Script(), true, false, false, "", 0, 0, 0},
    {AddressType::kP2wpkhAddress, /*1645*/ 2253, 0, Script(), 0, Script(), true, true, false, "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 2285, 0, Script(), 0, Script(), true, true, false, "", 0, 52, 0},
    // reissue
    {AddressType::kP2wpkhAddress, /*922*/ 1226, 0, Script(), 0, Script(), true, true, true, "", 0, 36, 0},
    {AddressType::kP2wpkhAddress, 1242, 0, Script(), 0, Script(), true, true, true, "", 0, 52, 0},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    Script script_template(test_data.script_template);
    Script* template_ptr = nullptr;
    if (!test_data.script_template.empty()) {
      template_ptr = &script_template;
    }
    EXPECT_NO_THROW((vsize = ConfidentialTxIn::EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script, test_data.pegin_btc_tx,
        test_data.claim_script, test_data.is_issuance, test_data.is_blind,
        test_data.is_reissuance, template_ptr,
        test_data.exponent, test_data.minimum_bits, nullptr,
        test_data.txoutproof_size)));
    EXPECT_EQ(vsize, test_data.size);
  }
}